

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMeshControl::CreateInterfaceElements(TPZMHMeshControl *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  TPZGeoEl *pTVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TPZGeoEl **ppTVar7;
  _Base_ptr p_Var8;
  TPZGeoEl *geo;
  TPZInterfaceElement *this_00;
  _Rb_tree_node_base *p_Var9;
  int iVar10;
  TPZGeoElSide smallGeoElSide;
  TPZGeoElSide gelside;
  _Self __tmp;
  TPZCompElSide csmall;
  TPZGeoElSide neighbour;
  TPZGeoElSide neighbour_1;
  TPZCompElSide celskeleton;
  TPZGeoElSide local_170;
  TPZGeoElSide local_158;
  TPZStack<TPZGeoElSide,_10> gelstack;
  
  TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
  p_Var9 = (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var9 == &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    p_Var1 = p_Var9[1]._M_parent;
    p_Var2 = p_Var9[1]._M_left;
    iVar10 = this->fLagrangeMatIdLeft;
    iVar4 = this->fLagrangeMatIdRight;
    if (p_Var2 == *(_Base_ptr *)(p_Var9 + 1) || (long)p_Var1 < (long)p_Var2) {
      iVar10 = this->fLagrangeMatIdRight;
      iVar4 = this->fLagrangeMatIdLeft;
    }
    ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZGeoEl_*,_10>,(int64_t)*(_Base_ptr *)(p_Var9 + 1));
    pTVar3 = *ppTVar7;
    iVar5 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
    gelside.fSide = iVar5 + -1;
    gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    gelside.fGeoEl = pTVar3;
    TPZGeoElSide::Reference(&gelside);
    if (celskeleton.fEl == (TPZCompEl *)0x0) break;
    TPZGeoElSide::Neighbour(&neighbour,&gelside);
    while (((neighbour.fGeoEl != gelside.fGeoEl || neighbour.fSide != gelside.fSide &&
            ((neighbour.fGeoEl)->fMatId != this->fSkeletonWrapMatId)) &&
           ((neighbour.fGeoEl)->fMatId != this->fBoundaryWrapMatId))) {
      TPZGeoElSide::Neighbour((TPZGeoElSide *)&gelstack,&neighbour);
      neighbour.fSide =
           (int)gelstack.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fNElements;
      neighbour.fGeoEl =
           (TPZGeoEl *)
           gelstack.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fStore;
    }
    if (neighbour.fSide == gelside.fSide && neighbour.fGeoEl == gelside.fGeoEl) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                 ,0x31d);
    }
    TPZStack<TPZGeoElSide,_10>::TPZStack(&gelstack);
    local_170.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    local_170.fSide = neighbour.fSide;
    local_170.fGeoEl = neighbour.fGeoEl;
    TPZStack<TPZGeoElSide,_10>::Push(&gelstack,&local_170);
    while (CONCAT44(gelstack.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                    fNElements._4_4_,
                    (int)gelstack.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                         fNElements) != 0) {
      TPZStack<TPZGeoElSide,_10>::Pop(&smallGeoElSide,&gelstack);
      iVar5 = TPZGeoElSide::Dimension(&smallGeoElSide);
      iVar6 = (**(code **)(*(long *)pTVar3 + 0x210))();
      if (iVar5 == iVar6) {
        TPZGeoElSide::Neighbour(&neighbour_1,&smallGeoElSide);
        while ((neighbour_1.fGeoEl != smallGeoElSide.fGeoEl ||
               (neighbour_1.fSide != smallGeoElSide.fSide))) {
          iVar5 = (**(code **)(*(long *)neighbour_1.fGeoEl + 0x210))();
          if (iVar5 == ((this->fGMesh).fRef)->fPointer->fDim) {
            TPZGeoElSide::Reference(&neighbour_1);
            if (csmall.fEl != (TPZCompEl *)0x0) {
              p_Var8 = (_Base_ptr)WhichSubdomain(this,csmall.fEl);
              iVar5 = iVar4;
              if (((p_Var8 != p_Var1) &&
                  (p_Var8 = (_Base_ptr)WhichSubdomain(this,csmall.fEl), iVar5 = iVar10,
                  p_Var8 != p_Var2)) || (iVar5 == -1)) {
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                           ,0x33d);
              }
              geo = (TPZGeoEl *)
                    (**(code **)(*(long *)smallGeoElSide.fGeoEl + 0x170))
                              (smallGeoElSide.fGeoEl,smallGeoElSide.fSide);
              this_00 = (TPZInterfaceElement *)operator_new(0x80);
              TPZInterfaceElement::TPZInterfaceElement
                        (this_00,((this->fCMesh).fRef)->fPointer,geo,&csmall,&celskeleton);
            }
            TPZGeoElSide::Neighbour(&local_158,&neighbour_1);
          }
          else {
            TPZGeoElSide::Neighbour(&local_158,&neighbour_1);
          }
          neighbour_1.fGeoEl = local_158.fGeoEl;
          neighbour_1.fSide = local_158.fSide;
        }
        TPZGeoElSide::GetSubElements2(&smallGeoElSide,&gelstack);
      }
    }
    TPZManVector<TPZGeoElSide,_10>::~TPZManVector(&gelstack.super_TPZManVector<TPZGeoElSide,_10>);
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
             ,0x311);
}

Assistant:

void TPZMHMeshControl::CreateInterfaceElements()
{
    fCMesh->LoadReferences();
    int dim = fGMesh->Dimension();
    std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
    /// loop over the skeleton elements
    for (it=fInterfaces.begin(); it != fInterfaces.end(); it++) {
        // index of the skeleton element
        int64_t elindex = it->first;
        // left and right indexes in the coarse mesh
        int64_t leftelindex = it->second.first;
        int64_t rightelindex = it->second.second;
        // skip boundary elements
        int matid = 0, matidleft = 0, matidright = 0;

        // second condition indicates a boundary element
        if (leftelindex < rightelindex || rightelindex == elindex)
        {
            matidleft = fLagrangeMatIdLeft;
            matidright = fLagrangeMatIdRight;
        }
        else
        {
            matidleft = fLagrangeMatIdRight;
            matidright = fLagrangeMatIdLeft;
        }
        int numlado = 2;
        if (rightelindex == elindex) {
            numlado = 1;
        }

        TPZGeoEl *gel = fGMesh->ElementVec()[elindex];
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        TPZCompElSide celskeleton = gelside.Reference();
        // the skeleton element must exist
        if(!celskeleton.Element()) DebugStop();
        TPZGeoElSide neighbour = gelside.Neighbour();
        while(neighbour != gelside)
        {
            int neighmatid = neighbour.Element()->MaterialId();
            if(neighmatid == fSkeletonWrapMatId || neighmatid == fBoundaryWrapMatId)
            {
                break;
            }
            neighbour = neighbour.Neighbour();
        }
        if (neighbour == gelside) {
            DebugStop();
        }
        TPZStack<TPZGeoElSide> gelstack;
        gelstack.Push(neighbour);
        while (gelstack.size())
        {
            TPZGeoElSide smallGeoElSide = gelstack.Pop();
            // the smaller elements returned by GetSubElements include element/sides of lower dimension
            if (smallGeoElSide.Dimension() != gel->Dimension()) {
                continue;
            }
            // look for the neighbours of smallGeoElSide for elements which are of dimension of the fGMesh
            // and which beint64_t to the subdomains
            TPZGeoElSide neighbour = smallGeoElSide.Neighbour();
            while (neighbour != smallGeoElSide)
            {
                if (neighbour.Element()->Dimension() != fGMesh->Dimension()) {
                    neighbour = neighbour.Neighbour();
                    continue;
                }
                TPZCompElSide csmall = neighbour.Reference();
                if (csmall)
                {
                    int matid = -1;
                    if(WhichSubdomain(csmall.Element()) == leftelindex) {
                        matid = matidleft;
                    }
                    else if(WhichSubdomain(csmall.Element()) == rightelindex)
                    {
                        matid = matidright;
                    }
                    if (matid == -1) {
                        DebugStop();
                    }
                    // create an interface between the finer element and the MHM flux
                    TPZGeoEl *gelnew = smallGeoElSide.Element()->CreateBCGeoEl(smallGeoElSide.Side(), matid);
                    new TPZInterfaceElement(fCMesh, gelnew, csmall, celskeleton);
#ifdef PZ_LOG
                    if (logger.isDebugEnabled()) {
                        std::stringstream sout;
                        sout << "New interface left " << smallGeoElSide.Element()->Index() << " right " << gel->Index() << " matid " << matid;
                        sout << " interface index " << gelnew->Reference()->Index() << " beint64_ts to subdomain " << WhichSubdomain(gelnew->Reference());
                        LOGPZ_DEBUG(logger, sout.str())
                    }
#endif
                }
                neighbour = neighbour.Neighbour();
            }

            smallGeoElSide.GetSubElements2(gelstack);
        }
    }
}